

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O2

int32_t utf8TextExtract(UText *ut,int64_t start,int64_t limit,UChar *dest,int32_t destCapacity,
                       UErrorCode *pErrorCode)

{
  char cVar1;
  byte bVar2;
  void *pvVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  UChar *pUVar7;
  long lVar8;
  int iVar9;
  uint8_t *s;
  int32_t length;
  int iVar10;
  int iVar11;
  UChar *pUVar12;
  int32_t local_50;
  int32_t local_4c;
  ulong local_48;
  UChar *local_40;
  UText *local_38;
  
  length = 0;
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((destCapacity < 0) || (destCapacity != 0 && dest == (UChar *)0x0)) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
      length = 0;
    }
    else {
      local_48 = (ulong)ut->b;
      uVar5 = start;
      if ((long)local_48 < start) {
        uVar5 = local_48;
      }
      length = 0;
      iVar10 = (int)uVar5;
      if (start < 0) {
        iVar10 = 0;
      }
      if (limit <= (long)local_48) {
        local_48 = limit;
      }
      local_48 = local_48 & 0xffffffff;
      if (limit < 0) {
        local_48 = 0;
      }
      iVar11 = (int)local_48;
      if (iVar11 < iVar10) {
        *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      }
      else {
        pvVar3 = ut->context;
        lVar6 = (long)iVar10;
        iVar9 = iVar10;
        if (lVar6 < ut->chunkNativeLimit) {
          iVar9 = iVar10 + -3;
          for (lVar8 = 0; (int)lVar8 != -3; lVar8 = lVar8 + -1) {
            cVar1 = *(char *)((long)pvVar3 + lVar8 + lVar6);
            if (((-1 < cVar1) || ((byte)(cVar1 + 0x3eU) < 0x33)) || (-lVar8 == lVar6)) {
              iVar9 = iVar10 + (int)lVar8;
              break;
            }
          }
        }
        lVar6 = (long)iVar11;
        if (lVar6 < ut->chunkNativeLimit) {
          for (lVar8 = 0; (int)lVar8 != -3; lVar8 = lVar8 + -1) {
            cVar1 = *(char *)((long)pvVar3 + lVar8 + lVar6);
            if (((-1 < cVar1) || ((byte)(cVar1 + 0x3eU) < 0x33)) || (-lVar8 == lVar6)) {
              local_48 = (ulong)(uint)(iVar11 + (int)lVar8);
              goto LAB_002c7061;
            }
          }
          local_48 = (ulong)(iVar11 - 3);
        }
LAB_002c7061:
        s = (uint8_t *)((long)pvVar3 + (long)iVar9);
        iVar9 = (int)local_48 - iVar9;
        pUVar7 = dest + (uint)destCapacity;
        if (dest == (UChar *)0x0) {
          pUVar7 = (UChar *)0x0;
        }
        local_50 = 0;
        iVar10 = 0;
        local_4c = destCapacity;
        local_40 = dest;
        local_38 = ut;
        while( true ) {
          while( true ) {
            pUVar12 = dest;
            if ((iVar9 <= local_50) || (pUVar7 <= dest)) goto LAB_002c7119;
            iVar11 = local_50 + 1;
            bVar2 = s[local_50];
            uVar4 = (uint)(char)bVar2;
            local_50 = iVar11;
            if (((char)bVar2 < '\0') &&
               (uVar4 = utf8_nextCharSafeBody_63(s,&local_50,iVar9,(uint)bVar2,-3), 0xffff < uVar4))
            break;
            *dest = (UChar)uVar4;
            dest = dest + 1;
          }
          pUVar12 = dest + 1;
          *dest = (short)(uVar4 >> 10) + L'ퟀ';
          if (pUVar7 <= pUVar12) break;
          dest[1] = (ushort)uVar4 & 0x3ff | 0xdc00;
          dest = dest + 2;
        }
        iVar10 = 1;
LAB_002c7119:
        while (lVar6 = (long)local_50, local_50 < iVar9) {
          local_50 = local_50 + 1;
          if ((char)s[lVar6] < '\0') {
            uVar4 = utf8_nextCharSafeBody_63(s,&local_50,iVar9,(uint)s[lVar6],-3);
            iVar10 = (iVar10 - (uint)(uVar4 < 0x10000)) + 2;
          }
          else {
            iVar10 = iVar10 + 1;
          }
        }
        length = iVar10 + (int)((ulong)((long)pUVar12 - (long)local_40) >> 1);
        u_terminateUChars_63(local_40,local_4c,length,pErrorCode);
        utf8TextAccess(local_38,(long)(int)local_48,'\x01');
      }
    }
  }
  return length;
}

Assistant:

static int32_t U_CALLCONV
utf8TextExtract(UText *ut,
                int64_t start, int64_t limit,
                UChar *dest, int32_t destCapacity,
                UErrorCode *pErrorCode) {
    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(destCapacity<0 || (dest==NULL && destCapacity>0)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    int32_t  length  = ut->b;
    int32_t  start32 = pinIndex(start, length);
    int32_t  limit32 = pinIndex(limit, length);

    if(start32>limit32) {
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }


    // adjust the incoming indexes to land on code point boundaries if needed.
    //    adjust by no more than three, because that is the largest number of trail bytes
    //    in a well formed UTF8 character.
    const uint8_t *buf = (const uint8_t *)ut->context;
    int i;
    if (start32 < ut->chunkNativeLimit) {
        for (i=0; i<3; i++) {
            if (U8_IS_SINGLE(buf[start32]) || U8_IS_LEAD(buf[start32]) || start32==0) {
                break;
            }
            start32--;
        }
    }

    if (limit32 < ut->chunkNativeLimit) {
        for (i=0; i<3; i++) {
            if (U8_IS_SINGLE(buf[limit32]) || U8_IS_LEAD(buf[limit32]) || limit32==0) {
                break;
            }
            limit32--;
        }
    }

    // Do the actual extract.
    int32_t destLength=0;
    utext_strFromUTF8(dest, destCapacity, &destLength,
                    (const char *)ut->context+start32, limit32-start32,
                    pErrorCode);
    utf8TextAccess(ut, limit32, TRUE);
    return destLength;
}